

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData160 * cfd::core::HashUtil::Ripemd160(ByteData160 *__return_storage_ptr__,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteData::GetBytes(&local_28,data);
  Ripemd160(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Ripemd160(const ByteData &data) {
  return Ripemd160(data.GetBytes());
}